

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Directed_Energy_Fire_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  StandardVariable *pSVar3;
  KINT32 Value;
  string local_300 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_2e0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Directed_Energy_Fire_PDU *local_18;
  Directed_Energy_Fire_PDU *this_local;
  
  local_18 = this;
  this_local = (Directed_Energy_Fire_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Directed Energy Fire PDU-\n");
  poVar2 = std::operator<<(poVar2,"Firing Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_FiringEntityID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Event ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_EventID);
  UTILS::IndentString(&local_230,&local_250,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"Munition Type:              ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_270,&this->m_MunTyp);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"Shot Start Time:            ");
  DATA_TYPE::ClockTime::GetAsString_abi_cxx11_(&local_290,&this->m_ShotStartTime);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"Cumulative Shot Time:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32CumulativeShotTime);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Emitter Location:           ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2b0,&this->m_EmitterLoc);
  poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
  poVar2 = std::operator<<(poVar2,"Aperture Diameter:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32AperDiameter);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Wavelength:                 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32Wavelength);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Peak Irradiance:            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32PeakIrradiance);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Pulse Repetition Frequency: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32PulseRepFreq);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Pulse Width:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)this->m_f32PulseWidth);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Flags:\n");
  poVar2 = std::operator<<(poVar2,"\tWeapon State: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_DeUnion).m_ui16Flags & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tState Update: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_DeUnion).m_ui16Flags >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Pulse Shape:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringBeamSpotShape_abi_cxx11_
            ((KString *)&citr,(ENUMS *)(ulong)this->m_ui8PulseShp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of DE Records:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumDERecs);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"DE Records:\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vDeRec);
  local_2e0._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vDeRec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2e0);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_300);
    std::operator<<(local_190,local_300);
    std::__cxx11::string::~string(local_300);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Directed_Energy_Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Directed Energy Fire PDU-\n"
       << "Firing Entity ID:\n"
       << IndentString( m_FiringEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "Munition Type:              " << m_MunTyp.GetAsString()
       << "Shot Start Time:            " << m_ShotStartTime.GetAsString()
       << "Cumulative Shot Time:       " << m_f32CumulativeShotTime                       << "\n"
       << "Emitter Location:           " << m_EmitterLoc.GetAsString()
       << "Aperture Diameter:          " << m_f32AperDiameter                             << "\n"
       << "Wavelength:                 " << m_f32Wavelength                               << "\n"
       << "Peak Irradiance:            " << m_f32PeakIrradiance                           << "\n"
       << "Pulse Repetition Frequency: " << m_f32PulseRepFreq                             << "\n"
       << "Pulse Width:                " << m_f32PulseWidth                               << "\n"
       << "Flags:\n"
       << "\tWeapon State: "             << m_DeUnion.m_ui16WeaponState                   << "\n"
       << "\tState Update: "             << m_DeUnion.m_ui16StateUpdate                   << "\n"
       << "Pulse Shape:                " << GetEnumAsStringBeamSpotShape( m_ui8PulseShp ) << "\n"
       << "Number Of DE Records:       " << m_ui16NumDERecs                               << "\n"
       << "DE Records:\n";

    vector<StdVarPtr>::const_iterator citr = m_vDeRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDeRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}